

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall CircularArrayTest_empty_Test::TestBody(CircularArrayTest_empty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_110;
  Message local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__2;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar__1;
  string local_80;
  AssertHelper local_60;
  Message local_58;
  bool local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  CircularArrayTest_empty_Test *this_local;
  
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_);
  local_49 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::empty
                       ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_
                       );
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_48,&local_49,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_48,(AssertionResult *)"ca.empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (bVar1) {
    anon_unknown.dwarf_f66d::TestObject::TestObject((TestObject *)&gtest_ar__1.message_,1,0);
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_,
               (value_type *)&gtest_ar__1.message_);
    anon_unknown.dwarf_f66d::TestObject::~TestObject((TestObject *)&gtest_ar__1.message_);
    bVar1 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::empty
                      ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_)
    ;
    local_a1 = (bool)((bVar1 ^ 0xffU) & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a0,&local_a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d8,(internal *)local_a0,(AssertionResult *)"ca.empty()","true","false",in_R9
                );
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                 ,0xb6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (bVar1) {
      anon_unknown.dwarf_f66d::TestObject::TestObject
                ((TestObject *)((long)&gtest_ar__2.message_.ptr_ + 4),2,0);
      wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
                ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_,
                 (value_type *)((long)&gtest_ar__2.message_.ptr_ + 4));
      anon_unknown.dwarf_f66d::TestObject::~TestObject
                ((TestObject *)((long)&gtest_ar__2.message_.ptr_ + 4));
      bVar1 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::empty
                        ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                         &gtest_ar_.message_);
      local_f9 = (bool)((bVar1 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_f8,&local_f9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_f8,
                   (AssertionResult *)"ca.empty()","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                   ,0xb9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_108);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if (bVar1) {
        wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back
                  ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_);
        bVar1 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::empty
                          ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                           &gtest_ar_.message_);
        local_141 = (bool)((bVar1 ^ 0xffU) & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_140,&local_141,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar1) {
          testing::Message::Message(&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_140,
                     (AssertionResult *)"ca.empty()","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                     ,0xbc,pcVar2);
          testing::internal::AssertHelper::operator=(&local_158,&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_150);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
        if (bVar1) {
          wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back
                    ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_);
          local_189 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::empty
                                ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                                 &gtest_ar_.message_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_188,&local_189,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
          if (!bVar1) {
            testing::Message::Message(&local_198);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_1c0,(internal *)local_188,(AssertionResult *)"ca.empty()","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                       ,0xbf,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
            testing::internal::AssertHelper::~AssertHelper(&local_1a0);
            std::__cxx11::string::~string((string *)&local_1c0);
            testing::Message::~Message(&local_198);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
        }
      }
    }
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(CircularArrayTest, empty) {
  CircularArray<TestObject, 2> ca;

  ASSERT_TRUE(ca.empty());

  ca.push_back(TestObject(1));
  ASSERT_FALSE(ca.empty());

  ca.push_back(TestObject(2));
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_FALSE(ca.empty());

  ca.pop_back();
  ASSERT_TRUE(ca.empty());
}